

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O2

BaseResultRenderer * __thiscall
duckdb::BaseResultRenderer::operator<<(BaseResultRenderer *this,char c)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  ::std::__cxx11::string::_M_construct((ulong)local_30,'\x01');
  (*this->_vptr_BaseResultRenderer[2])(this,local_30);
  ::std::__cxx11::string::~string((string *)local_30);
  return this;
}

Assistant:

BaseResultRenderer &BaseResultRenderer::operator<<(char c) {
	RenderLayout(string(1, c));
	return *this;
}